

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

ProFile * __thiscall
QMakeParser::parsedProFile(QMakeParser *this,QString *fileName,ParseFlags flags)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QMakeParser::ParseFlag> flags_00;
  Int IVar3;
  Entry *pEVar4;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  Entry *ent;
  ProFile *pro;
  QString contents_1;
  QString contents;
  iterator it;
  int id;
  VfsFlags vfsFlags;
  undefined4 in_stack_ffffffffffffff18;
  ParseFlag in_stack_ffffffffffffff1c;
  QString *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 uVar5;
  undefined8 in_stack_ffffffffffffff40;
  int id_00;
  QMakeParser *this_00;
  ProFile *this_01;
  QStringView in_stack_ffffffffffffff60;
  SubGrammar in_stack_ffffffffffffff80;
  SubGrammar grammar;
  QFlagsStorageHelper<QMakeParser::ParseFlag,_4> local_20;
  undefined4 local_1c;
  int local_18;
  
  id_00 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMakeParser *)0xaaaaaaaaaaaaaaaa;
  flags_00.i = (Int)QFlags<QMakeParser::ParseFlag>::operator&
                              ((QFlags<QMakeParser::ParseFlag> *)in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c);
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffec);
  QFlags<QMakeVfs::VfsFlag>::QFlags
            ((QFlags<QMakeVfs::VfsFlag> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  local_1c = 0xaaaaaaaa;
  local_18 = QMakeVfs::idForFileName
                       ((QMakeVfs *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                        (QString *)in_RDI,
                        (QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>)SUB84((ulong)this_00 >> 0x20,0));
  local_20.super_QFlagsStorage<QMakeParser::ParseFlag>.i =
       (QFlagsStorage<QMakeParser::ParseFlag>)
       QFlags<QMakeParser::ParseFlag>::operator&
                 ((QFlags<QMakeParser::ParseFlag> *)in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff1c);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
  uVar5 = false;
  if (IVar3 != 0) {
    uVar5 = in_RDI[5].m_data != (storage_type_conflict *)0x0;
  }
  if ((bool)uVar5 == false) {
    grammar = 0xaaaaaaaa;
    QString::QString((QString *)0x30e804);
    bVar2 = readFile(this_00,id_00,(ParseFlags)flags_00.i,
                     (QString *)CONCAT17(uVar5,in_stack_ffffffffffffff38));
    if (bVar2) {
      QStringView::QStringView<QString,_true>(in_RDI,in_stack_ffffffffffffff28);
      this_01 = parsedProBlock(this_00,in_stack_ffffffffffffff60,id_00,
                               (QString *)CONCAT17(uVar5,in_stack_ffffffffffffff38),
                               (int)((ulong)in_RDI >> 0x20),grammar);
    }
    else {
      this_01 = (ProFile *)0x0;
    }
    QString::~QString((QString *)0x30e887);
  }
  else {
    QHash<int,_ProFileCache::Entry>::find
              ((QHash<int,_ProFileCache::Entry> *)in_stack_ffffffffffffff20,
               (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QHash<int,_ProFileCache::Entry>::end
              ((QHash<int,_ProFileCache::Entry> *)in_stack_ffffffffffffff28);
    bVar2 = QHash<int,_ProFileCache::Entry>::iterator::operator!=
                      ((iterator *)in_stack_ffffffffffffff28,(iterator *)in_stack_ffffffffffffff20);
    if (bVar2) {
      pEVar4 = QHash<int,_ProFileCache::Entry>::iterator::operator*((iterator *)0x30e697);
      this_01 = pEVar4->pro;
      if (this_01 != (ProFile *)0x0) {
        ProFile::ref((ProFile *)0x30e6b9);
      }
    }
    else {
      pEVar4 = QHash<int,_ProFileCache::Entry>::operator[]
                         ((QHash<int,_ProFileCache::Entry> *)in_RDI,(int *)in_stack_ffffffffffffff28
                         );
      QString::QString((QString *)0x30e713);
      bVar2 = readFile(this_00,(int)((ulong)pEVar4 >> 0x20),(ParseFlags)flags_00.i,
                       (QString *)CONCAT17(uVar5,in_stack_ffffffffffffff38));
      if (bVar2) {
        QStringView::QStringView<QString,_true>(in_RDI,in_stack_ffffffffffffff28);
        this_01 = parsedProBlock(this_00,in_stack_ffffffffffffff60,(int)((ulong)pEVar4 >> 0x20),
                                 (QString *)CONCAT17(uVar5,in_stack_ffffffffffffff38),
                                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff80);
        ProFile::itemsRef(this_01);
        QString::squeeze(in_stack_ffffffffffffff20);
        ProFile::ref((ProFile *)0x30e7ac);
      }
      else {
        this_01 = (ProFile *)0x0;
      }
      pEVar4->pro = this_01;
      QString::~QString((QString *)0x30e7d1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

ProFile *QMakeParser::parsedProFile(const QString &fileName, ParseFlags flags)
{
    ProFile *pro;
    QMakeVfs::VfsFlags vfsFlags = ((flags & ParseCumulative) ? QMakeVfs::VfsCumulative
                                                             : QMakeVfs::VfsExact);
    int id = m_vfs->idForFileName(fileName, vfsFlags);
    if ((flags & ParseUseCache) && m_cache) {
        ProFileCache::Entry *ent;
#ifdef PROPARSER_THREAD_SAFE
        QMutexLocker locker(&m_cache->mutex);
#endif
        auto it = m_cache->parsed_files.find(id);
        if (it != m_cache->parsed_files.end()) {
            ent = &*it;
#ifdef PROPARSER_THREAD_SAFE
            if (ent->locker && !ent->locker->done) {
                ++ent->locker->waiters;
                QThreadPool::globalInstance()->releaseThread();
                ent->locker->cond.wait(locker.mutex());
                QThreadPool::globalInstance()->reserveThread();
                if (!--ent->locker->waiters) {
                    delete ent->locker;
                    ent->locker = 0;
                }
            }
#endif
            if ((pro = ent->pro))
                pro->ref();
        } else {
            ent = &m_cache->parsed_files[id];
#ifdef PROPARSER_THREAD_SAFE
            ent->locker = new ProFileCache::Entry::Locker;
            locker.unlock();
#endif
            QString contents;
            if (readFile(id, flags, &contents)) {
                pro = parsedProBlock(QStringView(contents), id, fileName, 1, FullGrammar);
                pro->itemsRef()->squeeze();
                pro->ref();
            } else {
                pro = nullptr;
            }
            ent->pro = pro;
#ifdef PROPARSER_THREAD_SAFE
            locker.relock();
            if (ent->locker->waiters) {
                ent->locker->done = true;
                ent->locker->cond.wakeAll();
            } else {
                delete ent->locker;
                ent->locker = 0;
            }
#endif
        }
    } else {
        QString contents;
        if (readFile(id, flags, &contents))
            pro = parsedProBlock(QStringView(contents), id, fileName, 1, FullGrammar);
        else
            pro = nullptr;
    }
    return pro;
}